

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SkipComment
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp,bool *containTypeDef)

{
  EncodedCharPtr last_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  uint uVar5;
  OLECHAR local_32;
  OLECHAR ch;
  EncodedCharPtr last;
  EncodedCharPtr p;
  bool *containTypeDef_local;
  EncodedCharPtr *pp_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  p = containTypeDef;
  containTypeDef_local = (bool *)pp;
  pp_local = (EncodedCharPtr *)this;
  if (containTypeDef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x5a9,"(containTypeDef != nullptr)","containTypeDef != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  last = *(EncodedCharPtr *)containTypeDef_local;
  *p = '\0';
  last_00 = this->m_pchLast;
  do {
    while( true ) {
      while( true ) {
        local_32 = UTF8EncodingPolicyBase<false>::ReadFirst(&last,last_00);
        uVar5 = (uint)(ushort)local_32;
        if (local_32 != L'\0') break;
        if (last_00 <= last) {
          this->m_currentCharacter = last + -1;
          *(EncodedCharPtr *)containTypeDef_local = last + -1;
          Error(this,-0x7ff5fc08);
        }
      }
      if ((uVar5 == 10) || (uVar5 == 0xd)) break;
      if (uVar5 == 0x2a) {
        if (*last == '/') {
          *(EncodedCharPtr *)containTypeDef_local = last + 1;
          return tkNone;
        }
      }
      else if ((uVar5 - 0x2028 < 2) ||
              ((BVar3 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar(local_32), BVar3 != 0 &&
               (local_32 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                                     (&this->super_UTF8EncodingPolicyBase<false>,local_32,&last,
                                      last_00), local_32 == L'\x2028' || local_32 == L'\x2029'))))
      break;
    }
    this->m_fHadEol = 1;
    this->m_currentCharacter = last;
    ScanNewLine(this,(uint)(ushort)local_32);
    last = this->m_currentCharacter;
  } while( true );
}

Assistant:

tokens Scanner<EncodingPolicy>::SkipComment(EncodedCharPtr *pp, /* out */ bool* containTypeDef)
{
    Assert(containTypeDef != nullptr);
    EncodedCharPtr p = *pp;
    *containTypeDef = false;
    EncodedCharPtr last = m_pchLast;
    OLECHAR ch;

    for (;;)
    {
        switch((ch = this->ReadFirst(p, last)))
        {
        case '*':
            if (*p == '/')
            {
                *pp = p + 1;
                return tkNone;
            }
            break;

        // ES 2015 11.3 Line Terminators
        case kchLS:         // 0x2028, classifies as new line
        case kchPS:         // 0x2029, classifies as new line
LEcmaLineBreak:
            goto LLineBreak;

        case kchRET:
        case kchNWL:
LLineBreak:
            m_fHadEol = TRUE;
            m_currentCharacter = p;
            ScanNewLine(ch);
            p = m_currentCharacter;
            break;

        case kchNUL:
            if (p >= last)
            {
                m_currentCharacter = p - 1;
                *pp = p - 1;
                Error(ERRnoCmtEnd);
            }
            break;

        default:
            if (this->IsMultiUnitChar(ch))
            {
                ch = this->template ReadRest<true>(ch, p, last);
                switch (ch)
                {
                case kchLS:
                case kchPS:
                    goto LEcmaLineBreak;
                }
            }
            break;
        }
    }
}